

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O1

void * upb_Message_ResizeArrayUninitialized
                 (upb_Message *msg,upb_MiniTableField *f,size_t size,upb_Arena *arena)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  upb_Extension *puVar4;
  void *pvVar5;
  upb_Array *array;
  ulong uVar6;
  ulong size_00;
  
  bVar1 = f->mode_dont_copy_me__upb_internal_use_only;
  if (bVar1 < 0xc0) {
LAB_003144b2:
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_NativePointer"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                  ,0xc4,
                  "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                 );
  }
  if ((bVar1 & 3) != 1) {
LAB_003144d1:
    __assert_fail("upb_MiniTableField_IsArray(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                  ,0xc5,
                  "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                 );
  }
  if (f->presence != 0) {
LAB_003144f0:
    __assert_fail("f->presence == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                  ,0xc6,
                  "void _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(const struct upb_MiniTableField *)"
                 );
  }
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x1eb,
                  "upb_Array *upb_Message_GetOrCreateMutableArray(struct upb_Message *, const upb_MiniTableField *, upb_Arena *)"
                 );
  }
  if ((bVar1 & 8) != 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  array = *(upb_Array **)
           ((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only);
  if (array == (upb_Array *)0x0) {
    bVar2 = f->descriptortype_dont_copy_me__upb_internal_use_only;
    if ((bVar1 & 0x10) == 0) {
      uVar6 = (ulong)(bVar2 - 1);
    }
    else {
      uVar6 = 0xd;
      if (bVar2 != 5) {
        if (bVar2 != 0xc) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                        ,0x7b,
                        "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
        }
        uVar6 = 8;
      }
    }
    bVar1 = _upb_FieldType_SizeLg2_dont_copy_me__upb_internal_use_only_size[uVar6];
    size_00 = (4L << (bVar1 & 0x3f)) + 0x1fU & 0xfffffffffffffff8;
    array = (upb_Array *)arena->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)array) < size_00) {
      array = (upb_Array *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,size_00);
    }
    else {
      if ((upb_Array *)
          ((ulong)((long)&array->data_dont_copy_me__upb_internal_use_only + 7U) & 0xfffffffffffffff8
          ) != array) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      arena->ptr_dont_copy_me__upb_internal_use_only =
           (char *)((long)&array->data_dont_copy_me__upb_internal_use_only + size_00);
    }
    if (array == (upb_Array *)0x0) {
      array = (upb_Array *)0x0;
    }
    else {
      array->data_dont_copy_me__upb_internal_use_only =
           (ulong)(uint)(int)(char)bVar1 - (ulong)((int)uVar6 != 7) | (ulong)(array + 1);
      array->size_dont_copy_me__upb_internal_use_only = 0;
      array->capacity_dont_copy_me__upb_internal_use_only = 4;
    }
    bVar1 = f->mode_dont_copy_me__upb_internal_use_only;
    if (bVar1 < 0xc0) goto LAB_003144b2;
    if ((bVar1 & 3) != 1) goto LAB_003144d1;
    if (f->presence != 0) goto LAB_003144f0;
    if ((bVar1 & 8) == 0) {
      if (((msg->field_0).internal_opaque & 1) != 0) {
        __assert_fail("!upb_Message_IsFrozen(msg)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x13b,
                      "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                     );
      }
      *(upb_Array **)((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only) =
           array;
    }
    else {
      if (((msg->field_0).internal_opaque & 1) != 0) {
        __assert_fail("!upb_Message_IsFrozen(msg)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x145,
                      "_Bool upb_Message_SetExtension(struct upb_Message *, const upb_MiniTableExtension *, const void *, upb_Arena *)"
                     );
      }
      puVar4 = _upb_Message_GetOrCreateExtension_dont_copy_me__upb_internal_use_only
                         (msg,(upb_MiniTableExtension *)f,arena);
      if (puVar4 != (upb_Extension *)0x0) {
        pvVar5 = (void *)(*(code *)(&DAT_004996ac +
                                   *(int *)(&DAT_004996ac +
                                           (ulong)(f->mode_dont_copy_me__upb_internal_use_only >> 6)
                                           * 4)))();
        return pvVar5;
      }
    }
  }
  if (array == (upb_Array *)0x0) {
LAB_00314491:
    pvVar5 = (void *)0x0;
  }
  else {
    if ((array->data_dont_copy_me__upb_internal_use_only & 4) != 0) {
      __assert_fail("!upb_Array_IsFrozen(array)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/array.h"
                    ,0x6c,
                    "_Bool _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only(struct upb_Array *, size_t, upb_Arena *)"
                   );
    }
    if (array->capacity_dont_copy_me__upb_internal_use_only < size) {
      _Var3 = _upb_Array_Realloc_dont_copy_me__upb_internal_use_only(array,size,arena);
      if (!_Var3) goto LAB_00314491;
    }
    array->size_dont_copy_me__upb_internal_use_only = size;
    pvVar5 = (void *)(array->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8);
  }
  return pvVar5;
}

Assistant:

UPB_API_INLINE void* upb_Message_ResizeArrayUninitialized(
    struct upb_Message* msg, const upb_MiniTableField* f, size_t size,
    upb_Arena* arena) {
  UPB_PRIVATE(_upb_MiniTableField_CheckIsArray)(f);
  upb_Array* arr = upb_Message_GetOrCreateMutableArray(msg, f, arena);
  if (!arr || !UPB_PRIVATE(_upb_Array_ResizeUninitialized)(arr, size, arena)) {
    return NULL;
  }
  return upb_Array_MutableDataPtr(arr);
}